

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::RemoveRPath(string *file,string *emsg,bool *removed)

{
  pointer ppVar1;
  void *pvVar2;
  pointer ppVar3;
  StringEntry *__tmp;
  StringEntry *pSVar4;
  StringEntry *pSVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  long *plVar8;
  string *psVar9;
  long lVar10;
  pointer ppVar11;
  char *pcVar12;
  StringEntry **ppSVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  pointer ppVar18;
  unsigned_long *puVar19;
  pointer pcVar20;
  bool bVar21;
  string *psVar22;
  bool bVar23;
  DynamicEntryList dentries;
  StringEntry *se [2];
  unsigned_long zeroSize [2];
  unsigned_long zeroPosition [2];
  ofstream f;
  pointer local_2b0;
  DynamicEntryList local_2a0;
  StringEntry *local_288 [2];
  string *local_278;
  bool *local_270;
  unsigned_long local_268 [4];
  vector<char,_std::allocator<char>_> local_248;
  undefined1 local_230 [32];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  if (removed != (bool *)0x0) {
    *removed = false;
  }
  local_268[2] = 0;
  local_268[3] = 0;
  local_268[0] = 0;
  local_268[1] = 0;
  cmELF::cmELF((cmELF *)local_230,(file->_M_dataplus)._M_p);
  local_288[0] = (StringEntry *)0x0;
  local_288[1] = (StringEntry *)0x0;
  pSVar4 = cmELF::GetRPath((cmELF *)local_230);
  if (pSVar4 == (StringEntry *)0x0) {
    ppSVar13 = local_288;
  }
  else {
    ppSVar13 = local_288 + 1;
    local_288[0] = pSVar4;
  }
  local_270 = removed;
  pSVar5 = cmELF::GetRunPath((cmELF *)local_230);
  if (pSVar5 == (StringEntry *)0x0) {
    psVar22 = (string *)0x1;
    if (pSVar4 == (StringEntry *)0x0) {
      cmELF::~cmELF((cmELF *)local_230);
      return true;
    }
  }
  else {
    *ppSVar13 = pSVar5;
    pSVar5 = local_288[0];
    if (pSVar4 == (StringEntry *)0x0) {
      psVar22 = (string *)0x1;
    }
    else {
      psVar22 = (string *)0x2;
      if (local_288[1]->IndexInSection < local_288[0]->IndexInSection) {
        local_288[0] = local_288[1];
        local_288[1] = pSVar5;
      }
    }
  }
  cmELF::GetDynamicEntries(&local_2a0,(cmELF *)local_230);
  ppVar3 = local_2a0.
           super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar1 = (pointer)CONCAT71(local_2a0.
                             super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_2a0.
                             super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_);
  local_278 = file;
  if (ppVar1 == local_2a0.
                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    if (emsg == (string *)0x0) {
      local_2b0 = (pointer)0x0;
      pcVar20 = (pointer)0x0;
      uVar6 = 0;
      psVar22 = (string *)0x0;
    }
    else {
      local_2b0 = (pointer)0x0;
      std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x51c52b);
      pcVar20 = (pointer)0x0;
      uVar6 = 0;
      psVar22 = (string *)0x0;
    }
  }
  else {
    psVar9 = (string *)0x0;
    do {
      pSVar4 = local_288[(long)psVar9];
      local_268[(long)((long)&(psVar9->_M_dataplus)._M_p + 2)] = pSVar4->Position;
      local_268[(long)psVar9] = pSVar4->Size;
      psVar9 = (string *)((long)&(psVar9->_M_dataplus)._M_p + 1);
    } while (psVar22 != psVar9);
    uVar6 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,1);
    uVar7 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,0);
    ppVar11 = (pointer)CONCAT71(local_2a0.
                                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                local_2a0.
                                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if (ppVar11 !=
        local_2a0.
        super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar16 = 0;
      lVar17 = -(long)local_2a0.
                      super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
      do {
        lVar17 = lVar17 + 0x10;
        lVar10 = -(long)ppVar11;
        puVar19 = &ppVar11[1].second;
        ppVar18 = ppVar11;
        while ((lVar14 = ppVar18->first, lVar14 != 0xf && (lVar14 != 0x1d))) {
          if (lVar14 == 0x70000035) {
            ppVar18->second = ppVar18->second + lVar16 * (uVar6 - uVar7);
          }
          ppVar18 = ppVar18 + 1;
          lVar10 = lVar10 + -0x10;
          puVar19 = puVar19 + 2;
          if (ppVar18 ==
              local_2a0.
              super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001c32e7;
        }
        if (((pointer)(0x10 - lVar10) !=
             local_2a0.
             super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (lVar14 = lVar10 - lVar17 >> 4, 0 < lVar14)) {
          uVar15 = lVar14 + 1;
          do {
            puVar19[-3] = ((pair<long,_unsigned_long> *)(puVar19 + -1))->first;
            puVar19[-2] = *puVar19;
            uVar15 = uVar15 - 1;
            puVar19 = puVar19 + 2;
          } while (1 < uVar15);
        }
        ppVar11 = (pointer)-lVar10;
        local_2a0.
        super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_2a0.
             super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        lVar16 = lVar16 + 1;
      } while (ppVar18 !=
               local_2a0.
               super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
LAB_001c32e7:
    cmELF::EncodeDynamicEntries(&local_248,(cmELF *)local_230,&local_2a0);
    local_2b0 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    uVar6 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,0);
    pcVar20 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  pvVar2 = (void *)CONCAT71(local_2a0.
                            super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_2a0.
                            super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_1_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_2a0.
                                 super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  cmELF::~cmELF((cmELF *)local_230);
  if (ppVar1 == ppVar3) {
    bVar21 = false;
    goto LAB_001c3582;
  }
  std::ofstream::ofstream(local_230,(local_278->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
  if ((abStack_210
       [(long)(((cmELFInternal *)(local_230._0_8_ + -0x58))->DynamicSectionStrings)._M_t._M_impl.
              super__Rb_tree_header._M_header._M_left] & 5) == 0) {
    plVar8 = (long *)std::ostream::seekp(local_230,uVar6,0);
    if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) == 0) {
      plVar8 = (long *)std::ostream::write(local_230,(long)pcVar20);
      if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) == 0) {
        if ((int)psVar22 != 0) {
          local_278 = psVar22;
          bVar23 = true;
          psVar22 = (string *)0x0;
          do {
            plVar8 = (long *)std::ostream::seekp((ostream *)local_230,
                                                 local_268[(long)((long)&(psVar22->_M_dataplus)._M_p
                                                                 + 2)],0);
            if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
              if (emsg != (string *)0x0) {
                std::__cxx11::string::operator=((string *)emsg,"Error seeking to RPATH position.");
              }
              goto LAB_001c3547;
            }
            for (uVar6 = local_268[(long)psVar22]; uVar6 != 0; uVar6 = uVar6 - 1) {
              local_2a0.
              super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_230,(char *)&local_2a0,1);
            }
            if ((abStack_210
                 [(long)(((cmELFInternal *)(local_230._0_8_ + -0x58))->DynamicSectionStrings)._M_t.
                        _M_impl.super__Rb_tree_header._M_header._M_left] & 5) != 0) {
              if (emsg != (string *)0x0) {
                std::__cxx11::string::operator=
                          ((string *)emsg,"Error writing the empty rpath string to the file.");
              }
              goto LAB_001c3510;
            }
            psVar22 = (string *)((long)&(psVar22->_M_dataplus)._M_p + 1);
            bVar23 = psVar22 < local_278;
          } while (psVar22 != local_278);
        }
        bVar23 = false;
LAB_001c3510:
        bVar21 = (bool)(bVar23 ^ 1);
        if ((local_270 != (bool *)0x0) && (!bVar23)) {
          *local_270 = true;
          bVar21 = true;
        }
        goto LAB_001c354a;
      }
      if (emsg != (string *)0x0) {
        pcVar12 = "Error replacing DYNAMIC table header.";
        goto LAB_001c346b;
      }
    }
    else if (emsg != (string *)0x0) {
      pcVar12 = "Error seeking to DYNAMIC table header for RPATH.";
      goto LAB_001c346b;
    }
LAB_001c3547:
    bVar21 = false;
  }
  else {
    if (emsg == (string *)0x0) goto LAB_001c3547;
    pcVar12 = "Error opening file for update.";
LAB_001c346b:
    bVar21 = false;
    std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,(ulong)pcVar12);
  }
LAB_001c354a:
  local_230._0_8_ = _VTT;
  *(undefined8 *)
   (local_230 +
   (long)_VTT[-1].DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_left) =
       _vtable;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
LAB_001c3582:
  if (pcVar20 != (pointer)0x0) {
    operator_delete(pcVar20,(long)local_2b0 - (long)pcVar20);
  }
  return bVar21;
}

Assistant:

bool cmSystemTools::RemoveRPath(std::string const& file, std::string* emsg,
                                bool* removed)
{
  if (removed) {
    *removed = false;
  }
  int zeroCount = 0;
  unsigned long zeroPosition[2] = { 0, 0 };
  unsigned long zeroSize[2] = { 0, 0 };
  unsigned long bytesBegin = 0;
  std::vector<char> bytes;
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());

    // Get the RPATH and RUNPATH entries from it and sort them by index
    // in the dynamic section header.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { nullptr, nullptr };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count++] = se_rpath;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count++] = se_runpath;
    }
    if (se_count == 0) {
      // There is no RPATH or RUNPATH anyway.
      return true;
    }
    if (se_count == 2 && se[1]->IndexInSection < se[0]->IndexInSection) {
      std::swap(se[0], se[1]);
    }

    // Obtain a copy of the dynamic entries
    cmELF::DynamicEntryList dentries = elf.GetDynamicEntries();
    if (dentries.empty()) {
      // This should happen only for invalid ELF files where a DT_NULL
      // appears before the end of the table.
      if (emsg) {
        *emsg = "DYNAMIC section contains a DT_NULL before the end.";
      }
      return false;
    }

    // Save information about the string entries to be zeroed.
    zeroCount = se_count;
    for (int i = 0; i < se_count; ++i) {
      zeroPosition[i] = se[i]->Position;
      zeroSize[i] = se[i]->Size;
    }

    // Get size of one DYNAMIC entry
    unsigned long const sizeof_dentry =
      elf.GetDynamicEntryPosition(1) - elf.GetDynamicEntryPosition(0);

    // Adjust the entry list as necessary to remove the run path
    unsigned long entriesErased = 0;
    for (cmELF::DynamicEntryList::iterator it = dentries.begin();
         it != dentries.end();) {
      if (it->first == cmELF::TagRPath || it->first == cmELF::TagRunPath) {
        it = dentries.erase(it);
        entriesErased++;
        continue;
      }
      if (cmELF::TagMipsRldMapRel != 0 &&
          it->first == cmELF::TagMipsRldMapRel) {
        // Background: debuggers need to know the "linker map" which contains
        // the addresses each dynamic object is loaded at. Most arches use
        // the DT_DEBUG tag which the dynamic linker writes to (directly) and
        // contain the location of the linker map, however on MIPS the
        // .dynamic section is always read-only so this is not possible. MIPS
        // objects instead contain a DT_MIPS_RLD_MAP tag which contains the
        // address where the dynamic linker will write to (an indirect
        // version of DT_DEBUG). Since this doesn't work when using PIE, a
        // relative equivalent was created - DT_MIPS_RLD_MAP_REL. Since this
        // version contains a relative offset, moving it changes the
        // calculated address. This may cause the dynamic linker to write
        // into memory it should not be changing.
        //
        // To fix this, we adjust the value of DT_MIPS_RLD_MAP_REL here. If
        // we move it up by n bytes, we add n bytes to the value of this tag.
        it->second += entriesErased * sizeof_dentry;
      }

      it++;
    }

    // Encode new entries list
    bytes = elf.EncodeDynamicEntries(dentries);
    bytesBegin = elf.GetDynamicEntryPosition(0);
  }

  // Open the file for update.
  cmsys::ofstream f(file.c_str(),
                    std::ios::in | std::ios::out | std::ios::binary);
  if (!f) {
    if (emsg) {
      *emsg = "Error opening file for update.";
    }
    return false;
  }

  // Write the new DYNAMIC table header.
  if (!f.seekp(bytesBegin)) {
    if (emsg) {
      *emsg = "Error seeking to DYNAMIC table header for RPATH.";
    }
    return false;
  }
  if (!f.write(&bytes[0], bytes.size())) {
    if (emsg) {
      *emsg = "Error replacing DYNAMIC table header.";
    }
    return false;
  }

  // Fill the RPATH and RUNPATH strings with zero bytes.
  for (int i = 0; i < zeroCount; ++i) {
    if (!f.seekp(zeroPosition[i])) {
      if (emsg) {
        *emsg = "Error seeking to RPATH position.";
      }
      return false;
    }
    for (unsigned long j = 0; j < zeroSize[i]; ++j) {
      f << '\0';
    }
    if (!f) {
      if (emsg) {
        *emsg = "Error writing the empty rpath string to the file.";
      }
      return false;
    }
  }

  // Everything was updated successfully.
  if (removed) {
    *removed = true;
  }
  return true;
}